

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

Expr str_ind(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
            int argc)

{
  _Bool _Var1;
  _Bool _Var2;
  ValueType VVar3;
  long lVar4;
  long lVar5;
  code *pcVar6;
  char *__s;
  Expr EVar8;
  Expr EVar9;
  Expr EVar10;
  Expr EVar11;
  Expr expr;
  Expr expr_00;
  Expr ptr;
  Expr ptr_00;
  Expr ptr_01;
  Expr expr_01;
  Expr ptr_02;
  Expr expr_02;
  Expr expr_03;
  Expr expr_04;
  anon_union_8_8_707b72ea_for_Expr_1 aVar7;
  
  hlp_check_args_count(argc,5,5,"__str-ind");
  EVar8._4_4_ = 0;
  EVar8.type = args->type;
  EVar8.field_1.val_atom = (args->field_1).val_atom;
  EVar8 = exec_eval(exec,callContext,EVar8);
  expr_04.field_1 = EVar8.field_1;
  expr_04._4_4_ = 0;
  expr_04.type = EVar8.type;
  _Var1 = is_true(exec,expr_04);
  EVar9._4_4_ = 0;
  EVar9.type = args[1].type;
  EVar9.field_1.val_atom = args[1].field_1.val_atom;
  EVar8 = exec_eval(exec,callContext,EVar9);
  ptr._4_4_ = 0;
  ptr.type = EVar8.type;
  ptr.field_1.val_atom = EVar8.field_1.val_atom;
  EVar8 = dereference(ptr);
  EVar10._4_4_ = 0;
  EVar10.type = args[2].type;
  EVar10.field_1.val_atom = args[2].field_1.val_atom;
  EVar9 = exec_eval(exec,callContext,EVar10);
  aVar7 = EVar9.field_1;
  VVar3 = EVar9.type;
  expr._4_4_ = 0;
  expr.type = args[3].type;
  expr.field_1.val_atom = args[3].field_1.val_atom;
  EVar10 = exec_eval(exec,callContext,expr);
  ptr_00._4_4_ = 0;
  ptr_00.type = EVar10.type;
  ptr_00.field_1.val_atom = EVar10.field_1.val_atom;
  EVar10 = dereference(ptr_00);
  lVar4 = longint_to_long(EVar10.field_1.val_int);
  expr_00._4_4_ = 0;
  expr_00.type = args[4].type;
  expr_00.field_1.val_atom = args[4].field_1.val_atom;
  EVar10 = exec_eval(exec,callContext,expr_00);
  ptr_01._4_4_ = 0;
  ptr_01.type = EVar10.type;
  ptr_01.field_1.val_atom = EVar10.field_1.val_atom;
  EVar10 = dereference(ptr_01);
  lVar5 = longint_to_long(EVar10.field_1.val_int);
  expr_01._4_4_ = 0;
  expr_01.type = VVar3;
  expr_01.field_1.val_atom = aVar7.val_atom;
  _Var2 = is_string(expr_01);
  if (_Var2) {
    ptr_02._4_4_ = 0;
    ptr_02.type = VVar3;
    ptr_02.field_1.val_atom = aVar7.val_atom;
    EVar9 = dereference(ptr_02);
    if (_Var1) {
      pcVar6 = string_last_index_of;
    }
    else {
      pcVar6 = string_index_of;
    }
    lVar4 = (*pcVar6)(EVar8.field_1.val_atom,EVar9.field_1.val_atom,lVar4,lVar5);
  }
  else {
    expr_02._4_4_ = 0;
    expr_02.type = VVar3;
    expr_02.field_1.val_atom = aVar7.val_atom;
    _Var2 = is_char(expr_02);
    if (!_Var2) {
      __s = "__str-ind: third argument must be string or char";
      goto LAB_001063b1;
    }
    if (_Var1) {
      pcVar6 = string_last_index_of_char;
    }
    else {
      pcVar6 = string_index_of_char;
    }
    lVar4 = (*pcVar6)(EVar8.field_1.val_atom,(int)EVar9.field_1._0_1_,lVar4,lVar5);
  }
  if (lVar4 == -1) {
    EVar8 = make_int_negative_one(exec);
  }
  else {
    EVar8 = make_int_from_long(exec,lVar4);
  }
  EVar11.field_1 = EVar8.field_1;
  EVar11.type = EVar8.type;
  expr_03._4_4_ = 0;
  expr_03.type = EVar11.type;
  expr_03.field_1.val_atom = EVar11.field_1.val_atom;
  _Var1 = is_none(expr_03);
  if (!_Var1) {
    EVar11._4_4_ = 0;
    return EVar11;
  }
  __s = "__str-ind: make_int failed";
LAB_001063b1:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_ind)
{
    hlp_check_args_count(argc, 5, 5, "__str-ind");

    bool reverse = is_true(exec, EVAL_ARG(0));
    pString str = dereference(EVAL_ARG(1)).val_str;
    Expr arg_sub = EVAL_ARG(2);
    size_t start = (size_t) longint_to_long(dereference(EVAL_ARG(3)).val_int);
    size_t count = (size_t) longint_to_long(dereference(EVAL_ARG(4)).val_int);

    size_t ind;
    if (is_string(arg_sub))
    {
        pString sub = dereference(arg_sub).val_str;
        // I'm just playing with C syntax :) It should call string_index_of or string_last_index_of
        ind = (reverse ? string_last_index_of : string_index_of)(str, sub, start, count);
    }
    else if (is_char(arg_sub))
    {
        char sub = arg_sub.val_char;
        ind = (reverse ? string_last_index_of_char : string_index_of_char)(str, sub, start, count);
    }
    else
    {
        log("__str-ind: third argument must be string or char");
        exit(1);
    }

    Expr res;
    if (ind == STR_ERROR)
        res = make_int_negative_one(exec);
    else
        res = make_int_from_long(exec, (long)ind);
    if (is_none(res))
    {
        log("__str-ind: make_int failed");
        exit(1);
    }
    return res;
}